

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_se_decode(aec_stream_conflict *strm)

{
  int iVar1;
  internal_state_conflict *piVar2;
  uint32_t uVar3;
  aec_stream_conflict *in_RDI;
  int32_t d1;
  int32_t m;
  internal_state_conflict *state;
  aec_stream_conflict *in_stack_ffffffffffffffd8;
  
  piVar2 = in_RDI->state;
  while( true ) {
    if (in_RDI->block_size <= piVar2->sample_counter) {
      piVar2->mode = m_next_cds;
      return 1;
    }
    uVar3 = fs_ask(in_stack_ffffffffffffffd8);
    if (uVar3 == 0) {
      return 0;
    }
    iVar1 = piVar2->fs;
    if (0x5a < iVar1) {
      return -1;
    }
    uVar3 = iVar1 - piVar2->se_table[iVar1 * 2 + 1];
    if ((piVar2->sample_counter & 1) == 0) {
      if (in_RDI->avail_out < (ulong)piVar2->bytes_per_sample) {
        return 0;
      }
      put_sample(in_RDI,piVar2->se_table[iVar1 << 1] - uVar3);
      piVar2->sample_counter = piVar2->sample_counter + 1;
    }
    if (in_RDI->avail_out < (ulong)piVar2->bytes_per_sample) break;
    put_sample(in_RDI,uVar3);
    piVar2->sample_counter = piVar2->sample_counter + 1;
    fs_drop(in_RDI);
  }
  return 0;
}

Assistant:

static int m_se_decode(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    while(state->sample_counter < strm->block_size) {
        int32_t m;
        int32_t d1;
        if (fs_ask(strm) == 0)
            return M_EXIT;
        m = state->fs;
        if (m > SE_TABLE_SIZE)
            return M_ERROR;
        d1 = m - state->se_table[2 * m + 1];

        if ((state->sample_counter & 1) == 0) {
            if (strm->avail_out < state->bytes_per_sample)
                return M_EXIT;
            put_sample(strm, state->se_table[2 * m] - d1);
            state->sample_counter++;
        }

        if (strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        put_sample(strm, d1);
        state->sample_counter++;
        fs_drop(strm);
    }

    state->mode = m_next_cds;
    return M_CONTINUE;
}